

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ObjComputeEdgeDelay
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              int fUseTwo)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_64;
  int local_60;
  int iFanMax2;
  int iFanMax1;
  int nCountMax;
  int DelayMax2;
  int DelayMax;
  int Status2;
  int Status1;
  int Delay;
  int iFan;
  int i;
  int fUseTwo_local;
  Vec_Int_t *vEdge2_local;
  Vec_Int_t *vEdge1_local;
  Vec_Int_t *vDelay_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  nCountMax = 0;
  iFanMax1 = 0;
  iFanMax2 = 0;
  local_60 = -1;
  local_64 = -1;
  Vec_IntWriteEntry(vEdge1,iObj,0);
  Vec_IntWriteEntry(vEdge2,iObj,0);
  iVar1 = Gia_ManHasMapping(p);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjIsLut(p,iObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsLut2(p,iObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x164,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = Gia_ObjLutSize2(p,iObj);
    if (4 < iVar1) {
      __assert_fail("Gia_ObjLutSize2(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x14e,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    for (Delay = 0; iVar1 = Gia_ObjLutSize2(p,iObj), Delay < iVar1; Delay = Delay + 1) {
      iVar1 = Gia_ObjLutFanin2(p,iObj,Delay);
      iVar2 = Vec_IntEntry(vDelay,iVar1);
      iVar2 = iVar2 + 10;
      if (nCountMax < iVar2) {
        iFanMax1 = nCountMax;
        iFanMax2 = 1;
        local_60 = iVar1;
        nCountMax = iVar2;
      }
      else if (nCountMax == iVar2) {
        iFanMax2 = iFanMax2 + 1;
        local_64 = iVar1;
        if (fUseTwo == 0) {
          iFanMax1 = nCountMax;
        }
      }
      else {
        iFanMax1 = Abc_MaxInt(iFanMax1,iVar2);
      }
    }
  }
  else {
    iVar1 = Gia_ObjLutSize(p,iObj);
    if (4 < iVar1) {
      __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x136,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    for (Delay = 0; iVar1 = Gia_ObjLutSize(p,iObj), Delay < iVar1; Delay = Delay + 1) {
      piVar3 = Gia_ObjLutFanins(p,iObj);
      iVar1 = piVar3[Delay];
      iVar2 = Vec_IntEntry(vDelay,iVar1);
      iVar2 = iVar2 + 10;
      if (nCountMax < iVar2) {
        iFanMax1 = nCountMax;
        iFanMax2 = 1;
        local_60 = iVar1;
        nCountMax = iVar2;
      }
      else if (nCountMax == iVar2) {
        iFanMax2 = iFanMax2 + 1;
        local_64 = iVar1;
        if (fUseTwo == 0) {
          iFanMax1 = nCountMax;
        }
      }
      else {
        iFanMax1 = Abc_MaxInt(iFanMax1,iVar2);
      }
    }
  }
  if (iFanMax2 < 1) {
    __assert_fail("nCountMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x165,
                  "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (10 < nCountMax) {
    if (iFanMax2 == 1) {
      iVar1 = Gia_ObjEdgeCount(local_60,vEdge1,vEdge2);
      if (iVar1 < 2) {
        Gia_ObjEdgeAdd(local_60,iObj,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(iObj,local_60,vEdge1,vEdge2);
        iVar1 = Abc_MaxInt(iFanMax1,nCountMax + -8);
        Vec_IntWriteEntry(vDelay,iObj,iVar1);
        return iVar1;
      }
    }
    else if ((fUseTwo != 0) && (iFanMax2 == 2)) {
      iVar1 = Gia_ObjEdgeCount(local_60,vEdge1,vEdge2);
      iVar2 = Gia_ObjEdgeCount(local_64,vEdge1,vEdge2);
      if ((iVar1 < 2) && (iVar2 < 2)) {
        Gia_ObjEdgeAdd(local_60,iObj,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(local_64,iObj,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(iObj,local_60,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(iObj,local_64,vEdge1,vEdge2);
        iVar1 = Abc_MaxInt(iFanMax1,nCountMax + -8);
        Vec_IntWriteEntry(vDelay,iObj,iVar1);
        return iVar1;
      }
    }
  }
  Vec_IntWriteEntry(vDelay,iObj,nCountMax);
  return nCountMax;
}

Assistant:

int Gia_ObjComputeEdgeDelay( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, int fUseTwo )
{
    int i, iFan, Delay, Status1, Status2;
    int DelayMax = 0, DelayMax2 = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        assert( Gia_ObjLutSize2(p, iObj) <= 4 );
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else assert( 0 );
    assert( nCountMax > 0 );
    if ( DelayMax <= 10 )
    {} // skip first level
    else if ( nCountMax == 1 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    else if ( fUseTwo && nCountMax == 2 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    return DelayMax;
}